

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void duckdb::TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  string_t *psVar1;
  ulong in_RCX;
  ulong in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  string_t input;
  string_t sVar3;
  string_t target_value;
  idx_t r;
  idx_t local_write_count;
  string_t local_write [2048];
  string_t *ptr;
  ParquetBaseStringOperator *this;
  string_t *target_value_00;
  ColumnWriterStatistics *local_8050;
  ulong local_8048;
  
  psVar1 = FlatVector::GetData<duckdb::string_t>((Vector *)0x5a4df4);
  uVar2 = extraout_RDX;
  for (local_8048 = in_RDX; local_8048 < in_RCX; local_8048 = local_8048 + 1) {
    this = *(ParquetBaseStringOperator **)&psVar1[local_8048].value;
    target_value_00 = (string_t *)psVar1[local_8048].value.pointer.ptr;
    input.value.pointer.ptr = (char *)uVar2;
    input.value._0_8_ = target_value_00;
    sVar3 = ParquetBaseStringOperator::Operation<duckdb::string_t,duckdb::string_t>(this,input);
    local_8050 = sVar3.value._8_8_;
    sVar3.value.pointer.ptr = (char *)target_value_00;
    sVar3.value._0_8_ = this;
    ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>(local_8050,sVar3);
    ParquetBaseStringOperator::WriteToStream<duckdb::string_t,duckdb::string_t>
              (target_value_00,(WriteStream *)this);
    uVar2 = extraout_RDX_00;
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}